

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpathclipper.cpp
# Opt level: O2

bool __thiscall QIntersectionFinder::linesIntersect(QIntersectionFinder *this,QLineF *a,QLineF *b)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  bool bVar6;
  bool bVar7;
  byte bVar8;
  long in_FS_OFFSET;
  ulong uVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  QPointF local_58;
  QPointF local_48;
  QPointF local_38;
  QPointF local_28;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  dVar14 = (a->pt1).xp;
  dVar1 = (a->pt1).yp;
  dVar12 = (a->pt2).xp;
  dVar2 = (a->pt2).yp;
  dVar3 = (b->pt1).xp;
  dVar4 = (b->pt1).yp;
  dVar16 = (b->pt2).xp;
  dVar5 = (b->pt2).yp;
  local_58.xp = dVar16;
  local_58.yp = dVar5;
  local_48.xp = dVar3;
  local_48.yp = dVar4;
  local_38.xp = dVar12;
  local_38.yp = dVar2;
  local_28.xp = dVar14;
  local_28.yp = dVar1;
  bVar6 = comparePoints(&local_28,&local_38);
  if (!bVar6) {
    bVar6 = comparePoints(&local_48,&local_58);
    if (!bVar6) {
      bVar6 = comparePoints(&local_28,&local_48);
      bVar7 = comparePoints(&local_38,&local_58);
      bVar8 = 1;
      if ((bVar6) && (bVar7)) goto LAB_0039c136;
      bVar6 = comparePoints(&local_28,&local_58);
      bVar7 = comparePoints(&local_38,&local_48);
      if ((bVar6) && (bVar7)) goto LAB_0039c136;
      dVar15 = dVar12 - dVar14;
      dVar13 = dVar2 - dVar1;
      dVar10 = dVar16 - dVar3;
      dVar11 = dVar5 - dVar4;
      dVar17 = dVar15 * dVar11 - dVar10 * dVar13;
      uVar9 = -(ulong)(dVar17 < -dVar17);
      if (1e-12 < (double)(~uVar9 & (ulong)dVar17 | (ulong)-dVar17 & uVar9)) {
        dVar12 = (dVar11 * (dVar3 - dVar14) - dVar10 * (dVar4 - dVar1)) * (1.0 / dVar17);
        bVar8 = 0;
        if ((0.0 <= dVar12) && (dVar12 <= 1.0)) {
          dVar14 = (dVar13 * (dVar3 - dVar14) - (dVar4 - dVar1) * dVar15) * (1.0 / dVar17);
          bVar8 = -(dVar14 <= 1.0) & -(0.0 <= dVar14);
        }
        goto LAB_0039c136;
      }
      dVar17 = -dVar13 * (dVar3 - dVar14) + dVar15 * (dVar4 - dVar1);
      uVar9 = -(ulong)(dVar17 < -dVar17);
      if ((double)(~uVar9 & (ulong)dVar17 | (ulong)-dVar17 & uVar9) <= 1e-12) {
        dVar17 = dVar15 * dVar15 + dVar13 * dVar13;
        dVar18 = (dVar3 - dVar14) * dVar15 + (dVar4 - dVar1) * dVar13;
        if ((dVar18 <= 0.0) || (dVar17 <= dVar18)) {
          dVar16 = dVar15 * (dVar16 - dVar14) + dVar13 * (dVar5 - dVar1);
          if ((dVar16 <= 0.0) || (dVar17 <= dVar16)) {
            dVar16 = dVar10 * dVar10 + dVar11 * dVar11;
            dVar14 = (dVar14 - dVar3) * dVar10 + (dVar1 - dVar4) * dVar11;
            if ((dVar14 <= 0.0) || (dVar16 <= dVar14)) {
              dVar14 = dVar10 * (dVar12 - dVar3) + (dVar2 - dVar4) * dVar11;
              bVar8 = -(dVar14 < dVar16) & -(0.0 < dVar14);
            }
          }
        }
        goto LAB_0039c136;
      }
    }
  }
  bVar8 = 0;
LAB_0039c136:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (bool)(bVar8 & 1);
  }
  __stack_chk_fail();
}

Assistant:

bool QIntersectionFinder::linesIntersect(const QLineF &a, const QLineF &b) const
{
    const QPointF p1 = a.p1();
    const QPointF p2 = a.p2();

    const QPointF q1 = b.p1();
    const QPointF q2 = b.p2();

    if (comparePoints(p1, p2) || comparePoints(q1, q2))
        return false;

    const bool p1_equals_q1 = comparePoints(p1, q1);
    const bool p2_equals_q2 = comparePoints(p2, q2);

    if (p1_equals_q1 && p2_equals_q2)
        return true;

    const bool p1_equals_q2 = comparePoints(p1, q2);
    const bool p2_equals_q1 = comparePoints(p2, q1);

    if (p1_equals_q2 && p2_equals_q1)
        return true;

    const QPointF pDelta = p2 - p1;
    const QPointF qDelta = q2 - q1;

    const qreal par = pDelta.x() * qDelta.y() - pDelta.y() * qDelta.x();

    if (qFuzzyIsNull(par)) {
        const QPointF normal(-pDelta.y(), pDelta.x());

        // coinciding?
        if (qFuzzyIsNull(dot(normal, q1 - p1))) {
            const qreal dp = dot(pDelta, pDelta);

            const qreal tq1 = dot(pDelta, q1 - p1);
            const qreal tq2 = dot(pDelta, q2 - p1);

            if ((tq1 > 0 && tq1 < dp) || (tq2 > 0 && tq2 < dp))
                return true;

            const qreal dq = dot(qDelta, qDelta);

            const qreal tp1 = dot(qDelta, p1 - q1);
            const qreal tp2 = dot(qDelta, p2 - q1);

            if ((tp1 > 0 && tp1 < dq) || (tp2 > 0 && tp2 < dq))
                return true;
        }

        return false;
    }

    const qreal invPar = 1 / par;

    const qreal tp = (qDelta.y() * (q1.x() - p1.x()) -
                      qDelta.x() * (q1.y() - p1.y())) * invPar;

    if (tp < 0 || tp > 1)
        return false;

    const qreal tq = (pDelta.y() * (q1.x() - p1.x()) -
                      pDelta.x() * (q1.y() - p1.y())) * invPar;

    return tq >= 0 && tq <= 1;
}